

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O2

void fixRpathsOnFile(string *original_file,string *file_to_fix)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pointer __rhs;
  allocator<char> local_139;
  string *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rpaths_to_fix;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  rpaths_to_fix.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rpaths_to_fix.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rpaths_to_fix.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = file_to_fix;
  bVar1 = Settings::fileHasRpath(original_file);
  if (bVar1) {
    Settings::getRpathsForFile
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&command,original_file);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&rpaths_to_fix,&command);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&command);
    local_130 = rpaths_to_fix.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (__rhs = rpaths_to_fix.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __rhs != local_130; __rhs = __rhs + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"install_name_tool -rpath ",&local_139);
      std::operator+(&local_90,&local_b0,__rhs);
      std::operator+(&local_f0,&local_90," ");
      Settings::insideLibPath_abi_cxx11_();
      std::operator+(&local_70,&local_f0,&local_d0);
      std::operator+(&local_50,&local_70," ");
      std::operator+(&command,&local_50,local_138);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      iVar2 = systemp(&command);
      if (iVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "\n\n/!\\ ERROR: An error occured while trying to fix rpath ");
        poVar3 = std::operator<<(poVar3,(string *)__rhs);
        poVar3 = std::operator<<(poVar3," of ");
        poVar3 = std::operator<<(poVar3,(string *)local_138);
        std::endl<char,std::char_traits<char>>(poVar3);
        exit(1);
      }
      std::__cxx11::string::~string((string *)&command);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&rpaths_to_fix);
  return;
}

Assistant:

void fixRpathsOnFile(const string& original_file, const string& file_to_fix)
{
    vector<string> rpaths_to_fix;
    if (!Settings::fileHasRpath(original_file))
        return;

    rpaths_to_fix = Settings::getRpathsForFile(original_file);
    for (const auto& rpath_to_fix : rpaths_to_fix)
    {
        string command = string("install_name_tool -rpath ")
                       + rpath_to_fix + " " + Settings::insideLibPath() + " " + file_to_fix;
        if (systemp(command) != 0)
        {
            cerr << "\n\n/!\\ ERROR: An error occured while trying to fix rpath "
                      << rpath_to_fix << " of " << file_to_fix << endl;
            exit(1);
        }
    }
}